

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O3

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
TxOrphanage::GetChildrenFromSamePeer
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *__return_storage_ptr__,TxOrphanage *this,CTransactionRef *parent,NodeId nodeid)

{
  long lVar1;
  const_iterator __cbeg;
  element_type *peVar2;
  const_iterator cVar3;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
  *child_iter;
  long *plVar9;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
  __i;
  long lVar10;
  long in_FS_OFFSET;
  long *local_88;
  long *plStack_80;
  long local_78;
  key_type local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (long *)0x0;
  plStack_80 = (long *)0x0;
  local_78 = 0;
  peVar2 = (parent->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
      ;
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)
            ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)
            ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_68.n = (uint32_t)uVar5;
      cVar3 = std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
              ::find(&(this->m_outpoint_to_orphan_it)._M_t,&local_68);
      if ((_Rb_tree_header *)cVar3._M_node !=
          &(this->m_outpoint_to_orphan_it)._M_t._M_impl.super__Rb_tree_header) {
        for (p_Var4 = *(_Rb_tree_node_base **)(cVar3._M_node + 3);
            p_Var4 != (_Rb_tree_node_base *)&cVar3._M_node[2]._M_left;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          if (*(long *)(*(long *)(p_Var4 + 1) + 0x50) == nodeid) {
            std::
            vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
            ::
            emplace_back<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const&>
                      ((vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
                        *)&local_88,
                       (_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                        *)(p_Var4 + 1));
          }
        }
      }
      plVar7 = plStack_80;
      plVar9 = local_88;
      peVar2 = (parent->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar5 = (ulong)((uint32_t)uVar5 + 1);
      uVar6 = ((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
    if (local_88 != plStack_80) {
      lVar10 = (long)plStack_80 - (long)local_88;
      uVar5 = lVar10 >> 3;
      lVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<TxOrphanage::GetChildrenFromSamePeer(std::shared_ptr<CTransaction_const>const&,long)const::__0>>
                (local_88,plStack_80,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar10 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<TxOrphanage::GetChildrenFromSamePeer(std::shared_ptr<CTransaction_const>const&,long)const::__0>>
                  (plVar9,plVar7);
      }
      else {
        plVar8 = plVar9 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<TxOrphanage::GetChildrenFromSamePeer(std::shared_ptr<CTransaction_const>const&,long)const::__0>>
                  (plVar9,plVar8);
        for (; plVar8 != plVar7; plVar8 = plVar8 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,__gnu_cxx::__ops::_Val_comp_iter<TxOrphanage::GetChildrenFromSamePeer(std::shared_ptr<CTransaction_const>const&,long)const::__0>>
                    (plVar8);
        }
      }
    }
  }
  plVar9 = local_88;
  if (local_88 != plStack_80) {
    plVar9 = local_88 + 1;
    do {
      plVar7 = plVar9;
      plVar9 = plStack_80;
      if (plVar7 == plStack_80) goto LAB_003e18c9;
      plVar9 = plVar7 + 1;
    } while (plVar7[-1] != *plVar7);
    plVar8 = plVar7 + -1;
    lVar1 = plVar7[-1];
    for (; plVar9 != plStack_80; plVar9 = plVar9 + 1) {
      lVar10 = *plVar9;
      if (lVar1 != lVar10) {
        plVar8[1] = lVar10;
        plVar8 = plVar8 + 1;
      }
      lVar1 = lVar10;
    }
    plVar8 = plVar8 + 1;
    plVar9 = plStack_80;
    if (plVar8 != plStack_80) {
      plVar9 = plVar8;
      plStack_80 = plVar8;
    }
  }
LAB_003e18c9:
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::reserve(__return_storage_ptr__,(long)plVar9 - (long)local_88 >> 3);
  plVar7 = plStack_80;
  for (plVar9 = local_88; plVar9 != plVar7; plVar9 = plVar9 + 1) {
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>&>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)__return_storage_ptr__,(shared_ptr<const_CTransaction> *)(*plVar9 + 0x40));
  }
  if (local_88 != (long *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CTransactionRef> TxOrphanage::GetChildrenFromSamePeer(const CTransactionRef& parent, NodeId nodeid) const
{
    // First construct a vector of iterators to ensure we do not return duplicates of the same tx
    // and so we can sort by nTimeExpire.
    std::vector<OrphanMap::iterator> iters;

    // For each output, get all entries spending this prevout, filtering for ones from the specified peer.
    for (unsigned int i = 0; i < parent->vout.size(); i++) {
        const auto it_by_prev = m_outpoint_to_orphan_it.find(COutPoint(parent->GetHash(), i));
        if (it_by_prev != m_outpoint_to_orphan_it.end()) {
            for (const auto& elem : it_by_prev->second) {
                if (elem->second.fromPeer == nodeid) {
                    iters.emplace_back(elem);
                }
            }
        }
    }

    // Sort by address so that duplicates can be deleted. At the same time, sort so that more recent
    // orphans (which expire later) come first.  Break ties based on address, as nTimeExpire is
    // quantified in seconds and it is possible for orphans to have the same expiry.
    std::sort(iters.begin(), iters.end(), [](const auto& lhs, const auto& rhs) {
        if (lhs->second.nTimeExpire == rhs->second.nTimeExpire) {
            return &(*lhs) < &(*rhs);
        } else {
            return lhs->second.nTimeExpire > rhs->second.nTimeExpire;
        }
    });
    // Erase duplicates
    iters.erase(std::unique(iters.begin(), iters.end()), iters.end());

    // Convert to a vector of CTransactionRef
    std::vector<CTransactionRef> children_found;
    children_found.reserve(iters.size());
    for (const auto& child_iter : iters) {
        children_found.emplace_back(child_iter->second.tx);
    }
    return children_found;
}